

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O2

Result __thiscall wabt::TypeChecker::OnDelegate(TypeChecker *this,Index depth)

{
  LabelType LVar1;
  Result RVar2;
  Result RVar3;
  Label *try_label;
  Label *label;
  
  RVar2 = GetLabel(this,depth + 1,&label);
  if ((RVar2.enum_ != Error) && (RVar2 = TopLabel(this,&try_label), RVar2.enum_ != Error)) {
    LVar1 = try_label->label_type;
    RVar2 = PopAndCheckSignature(this,&try_label->result_types,"try block");
    RVar3 = CheckTypeStackEnd(this,"try block");
    ResetTypeStackToLabel(this,try_label);
    PushTypes(this,&try_label->result_types);
    std::vector<wabt::TypeChecker::Label,_std::allocator<wabt::TypeChecker::Label>_>::pop_back
              (&this->label_stack_);
    return (Result)(uint)((RVar3.enum_ == Error || RVar2.enum_ == Error) || LVar1 != Try);
  }
  return (Result)Error;
}

Assistant:

Result TypeChecker::OnDelegate(Index depth) {
  Result result = Result::Ok;
  Label* label;
  // Delegate starts counting after the current try, as the delegate
  // instruction is not actually in the try block.
  CHECK_RESULT(GetLabel(depth + 1, &label));

  Label* try_label;
  CHECK_RESULT(TopLabel(&try_label));
  result |= CheckLabelType(try_label, LabelType::Try);
  result |= PopAndCheckSignature(try_label->result_types, "try block");
  result |= CheckTypeStackEnd("try block");
  ResetTypeStackToLabel(try_label);

  // Since an end instruction does not follow a delegate, we push
  // the block results here and pop the label.
  PushTypes(try_label->result_types);
  PopLabel();
  return result;
}